

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void tinygltf::WriteBinaryGltfStream(ostream *stream,string *content)

{
  ulong uVar1;
  uint uVar2;
  int model_format;
  int length;
  int version;
  int model_length;
  string padding;
  string header;
  
  std::__cxx11::string::string((string *)&header,"glTF",(allocator *)&padding);
  version = 2;
  uVar1 = content->_M_string_length;
  uVar2 = (uint)uVar1 & 3;
  length = (uint)uVar1 + uVar2 + 0x14;
  std::ostream::write((char *)stream,(long)header._M_dataplus._M_p);
  std::ostream::write((char *)stream,(long)&version);
  std::ostream::write((char *)stream,(long)&length);
  model_length = (int)content->_M_string_length + uVar2;
  model_format = 0x4e4f534a;
  std::ostream::write((char *)stream,(long)&model_length);
  std::ostream::write((char *)stream,(long)&model_format);
  std::ostream::write((char *)stream,(long)(content->_M_dataplus)._M_p);
  if ((uVar1 & 3) != 0) {
    padding._M_dataplus._M_p = (pointer)&padding.field_2;
    std::__cxx11::string::_M_construct((ulong)&padding,(byte)uVar1 & 3);
    std::ostream::write((char *)stream,(long)padding._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&padding);
  }
  std::__cxx11::string::~string((string *)&header);
  return;
}

Assistant:

static void WriteBinaryGltfStream(std::ostream &stream,
                                  const std::string &content) {
  const std::string header = "glTF";
  const int version = 2;
  const int padding_size = content.size() % 4;

  // 12 bytes for header, JSON content length, 8 bytes for JSON chunk info,
  // padding
  const int length = 12 + 8 + int(content.size()) + padding_size;

  stream.write(header.c_str(), std::streamsize(header.size()));
  stream.write(reinterpret_cast<const char *>(&version), sizeof(version));
  stream.write(reinterpret_cast<const char *>(&length), sizeof(length));

  // JSON chunk info, then JSON data
  const int model_length = int(content.size()) + padding_size;
  const int model_format = 0x4E4F534A;
  stream.write(reinterpret_cast<const char *>(&model_length),
               sizeof(model_length));
  stream.write(reinterpret_cast<const char *>(&model_format),
               sizeof(model_format));
  stream.write(content.c_str(), std::streamsize(content.size()));

  // Chunk must be multiplies of 4, so pad with spaces
  if (padding_size > 0) {
    const std::string padding = std::string(size_t(padding_size), ' ');
    stream.write(padding.c_str(), std::streamsize(padding.size()));
  }
}